

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDisc_dns.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  long nst;
  long nst2;
  long nst1;
  sunrealtype t;
  sunrealtype t2;
  sunrealtype t1;
  sunrealtype t0;
  sunrealtype abstol;
  sunrealtype reltol;
  int retval;
  int flag;
  N_Vector y;
  SUNContext sunctx;
  SUNLinearSolver LS;
  SUNMatrix A;
  void *cvode_mem;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  long local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  long *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_40 = 0x3f50624dd2f1a9fc;
  local_48 = 0x3f1a36e2eb1c432d;
  local_50 = 0.0;
  local_58 = 1.0;
  local_60 = 2.0;
  local_38 = SUNContext_Create(0,&local_28);
  iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
  if (iVar1 == 0) {
    local_30 = (long *)N_VNew_Serial(1,local_28);
    **(undefined8 **)(*local_30 + 0x10) = 0x3ff0000000000000;
    local_10 = CVodeCreate(2,local_28);
    iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c);
    if (iVar1 == 0) {
      local_38 = CVodeInit(local_50,local_10,f,local_30);
      iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff7c);
      if (iVar1 == 0) {
        local_38 = CVodeSStolerances(local_40,local_48,local_10);
        iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff7c);
        if (iVar1 == 0) {
          local_38 = CVodeSetUserData(local_10,&local_34);
          iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff7c);
          if (iVar1 == 0) {
            local_18 = SUNDenseMatrix(1,1,local_28);
            iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff7c);
            if (iVar1 == 0) {
              local_20 = SUNLinSol_Dense(local_30,local_18,local_28);
              iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                   in_stack_ffffffffffffff7c);
              if (iVar1 == 0) {
                local_38 = CVodeSetLinearSolver(local_10,local_20,local_18);
                iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                     in_stack_ffffffffffffff7c);
                if (iVar1 == 0) {
                  printf("\nDiscontinuity in solution\n\n");
                  local_38 = CVodeSetStopTime(local_58,local_10);
                  iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                       in_stack_ffffffffffffff7c);
                  if (iVar1 == 0) {
                    local_34 = 1;
                    local_68 = local_50;
                    printf("%12.8e  %12.8e\n",local_50,**(undefined8 **)(*local_30 + 0x10));
                    while (local_68 < local_58) {
                      local_38 = CVode(local_58,local_10,local_30,&local_68,2);
                      iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                           in_stack_ffffffffffffff7c);
                      if (iVar1 != 0) {
                        return 1;
                      }
                      printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*local_30 + 0x10));
                    }
                    local_38 = CVodeGetNumSteps(local_10,&local_70);
                    iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                         in_stack_ffffffffffffff7c);
                    if (iVar1 == 0) {
                      **(undefined8 **)(*local_30 + 0x10) = 0x3ff0000000000000;
                      local_38 = CVodeReInit(local_58,local_10,local_30);
                      iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                           in_stack_ffffffffffffff7c);
                      if (iVar1 == 0) {
                        local_38 = CVodeSetStopTime(local_60,local_10);
                        iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                             in_stack_ffffffffffffff7c);
                        if (iVar1 == 0) {
                          local_34 = 1;
                          local_68 = local_58;
                          printf("%12.8e  %12.8e\n",local_58,**(undefined8 **)(*local_30 + 0x10));
                          while (local_68 < local_60) {
                            local_38 = CVode(local_60,local_10,local_30,&local_68,2);
                            iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                                                 ,in_stack_ffffffffffffff7c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*local_30 + 0x10));
                          }
                          local_38 = CVodeGetNumSteps(local_10,&stack0xffffffffffffff88);
                          iVar1 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                               in_stack_ffffffffffffff7c);
                          if (iVar1 == 0) {
                            pcVar2 = (char *)(local_70 + (long)in_stack_ffffffffffffff88);
                            printf("\nNumber of steps: %ld + %ld = %ld\n",local_70,
                                   in_stack_ffffffffffffff88,pcVar2);
                            printf("\nDiscontinuity in RHS: Case 1 - explicit treatment\n\n");
                            **(undefined8 **)(*local_30 + 0x10) = 0x3ff0000000000000;
                            local_38 = CVodeReInit(local_50,local_10,local_30);
                            iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                 in_stack_ffffffffffffff7c);
                            if (iVar1 == 0) {
                              local_38 = CVodeSetStopTime(local_58,local_10);
                              iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                   in_stack_ffffffffffffff7c);
                              if (iVar1 == 0) {
                                local_34 = 1;
                                local_68 = local_50;
                                printf("%12.8e  %12.8e\n",local_50,
                                       **(undefined8 **)(*local_30 + 0x10));
                                while (local_68 < local_58) {
                                  local_38 = CVode(local_58,local_10,local_30,&local_68,2);
                                  iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                       in_stack_ffffffffffffff7c);
                                  if (iVar1 != 0) {
                                    return 1;
                                  }
                                  printf("%12.8e  %12.8e\n",local_68,
                                         **(undefined8 **)(*local_30 + 0x10));
                                }
                                local_38 = CVodeGetNumSteps(local_10,&local_70);
                                iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                     in_stack_ffffffffffffff7c);
                                if (iVar1 == 0) {
                                  local_38 = CVodeReInit(local_58,local_10,local_30);
                                  local_38 = CVodeSetStopTime(local_60,local_10);
                                  iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                       in_stack_ffffffffffffff7c);
                                  if (iVar1 == 0) {
                                    local_34 = 2;
                                    local_68 = local_58;
                                    printf("%12.8e  %12.8e\n",local_58,
                                           **(undefined8 **)(*local_30 + 0x10));
                                    while (local_68 < local_60) {
                                      local_38 = CVode(local_60,local_10,local_30,&local_68,2);
                                      iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                           in_stack_ffffffffffffff7c);
                                      if (iVar1 != 0) {
                                        return 1;
                                      }
                                      printf("%12.8e  %12.8e\n",local_68,
                                             **(undefined8 **)(*local_30 + 0x10));
                                    }
                                    local_38 = CVodeGetNumSteps(local_10,&stack0xffffffffffffff88);
                                    iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                         in_stack_ffffffffffffff7c);
                                    if (iVar1 == 0) {
                                      pcVar2 = (char *)(local_70 + (long)in_stack_ffffffffffffff88);
                                      printf("\nNumber of steps: %ld + %ld = %ld\n",local_70,
                                             in_stack_ffffffffffffff88,pcVar2);
                                      printf(
                                            "\nDiscontinuity in RHS: Case 2 - let CVODE deal with it\n\n"
                                            );
                                      **(undefined8 **)(*local_30 + 0x10) = 0x3ff0000000000000;
                                      local_38 = CVodeReInit(local_50,local_10,local_30);
                                      iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                           in_stack_ffffffffffffff7c);
                                      if (iVar1 == 0) {
                                        local_38 = CVodeSetStopTime(local_58,local_10);
                                        iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                             in_stack_ffffffffffffff7c);
                                        if (iVar1 == 0) {
                                          local_34 = 1;
                                          local_68 = local_50;
                                          printf("%12.8e  %12.8e\n",local_50,
                                                 **(undefined8 **)(*local_30 + 0x10));
                                          while (local_68 < local_58) {
                                            local_38 = CVode(local_58,local_10,local_30,&local_68,2)
                                            ;
                                            iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                                 in_stack_ffffffffffffff7c);
                                            if (iVar1 != 0) {
                                              return 1;
                                            }
                                            printf("%12.8e  %12.8e\n",local_68,
                                                   **(undefined8 **)(*local_30 + 0x10));
                                          }
                                          local_38 = CVodeGetNumSteps(local_10,&local_70);
                                          iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                               in_stack_ffffffffffffff7c);
                                          if (iVar1 == 0) {
                                            local_38 = CVodeSetStopTime(local_60,local_10);
                                            iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                                 in_stack_ffffffffffffff7c);
                                            if (iVar1 == 0) {
                                              local_34 = 2;
                                              local_68 = local_58;
                                              printf("%12.8e  %12.8e\n",local_58,
                                                     **(undefined8 **)(*local_30 + 0x10));
                                              while (local_68 < local_60) {
                                                local_38 = CVode(local_60,local_10,local_30,
                                                                 &local_68,2);
                                                iVar1 = check_retval(in_stack_ffffffffffffff88,
                                                                     pcVar2,
                                                  in_stack_ffffffffffffff7c);
                                                if (iVar1 != 0) {
                                                  return 1;
                                                }
                                                printf("%12.8e  %12.8e\n",local_68,
                                                       **(undefined8 **)(*local_30 + 0x10));
                                              }
                                              local_38 = CVodeGetNumSteps(local_10,&
                                                  stack0xffffffffffffff80);
                                              iVar1 = check_retval(in_stack_ffffffffffffff88,pcVar2,
                                                                   in_stack_ffffffffffffff7c);
                                              if (iVar1 == 0) {
                                                printf("\nNumber of steps: %ld + %ld = %ld\n",
                                                       local_70,(long)pcVar2 - local_70,pcVar2);
                                                N_VDestroy(local_30);
                                                SUNMatDestroy(local_18);
                                                SUNLinSolFree(local_20);
                                                CVodeFree(&local_10);
                                                SUNContext_Free(&local_28);
                                                local_4 = 0;
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  void* cvode_mem;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext sunctx;

  N_Vector y;
  int flag, retval;
  sunrealtype reltol, abstol, t0, t1, t2, t;
  long int nst1, nst2, nst;

  reltol = SUN_RCONST(1.0e-3);
  abstol = SUN_RCONST(1.0e-4);

  t0 = SUN_RCONST(0.0);
  t1 = SUN_RCONST(1.0);
  t2 = SUN_RCONST(2.0);

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate the vector of initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /*
   * ------------------------------------------------------------
   *  Shared initialization and setup
   * ------------------------------------------------------------
   */

  /* Call CVodeCreate to create CVODE memory block and specify the
   * Backward Differentiaion Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize integrator memory and specify the
   * user's right hand side function y'=f(t,y), the initial time T0
   * and the initial condiition vector y. */
  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval((void*)&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify integration tolereances,
   * specifically the scalar relative and absolute tolerance. */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval((void*)&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Provide RHS flag as user data which can be access in user provided routines */
  retval = CVodeSetUserData(cvode_mem, &flag);
  if (check_retval((void*)&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solver */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense linear solver for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the linear solver and matrix to CVode by calling CVodeSetLinearSolver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval((void*)&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /*
   * ---------------------------------------------------------------
   * Discontinuity in the solution
   *
   * 1) Integrate to the discontinuity
   * 2) Integrate from the discontinuity
   * ---------------------------------------------------------------
   */

  /* ---- Integrate to the discontinuity */

  printf("\nDiscontinuity in solution\n\n");

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }
  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* ---- Integrate from the discontinuity */

  /* Include discontinuity */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver */
  retval = CVodeReInit(cvode_mem, t1, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst2);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst = nst1 + nst2;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /*
   * ---------------------------------------------------------------
   * Discontinuity in RHS: Case 1 - explicit treatment
   * Note that it is not required to set TSTOP, but without it
   * we would have to find y(t1) to reinitialize the solver.
   * ---------------------------------------------------------------
   */

  printf("\nDiscontinuity in RHS: Case 1 - explicit treatment\n\n");

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver. CVodeReInit does not reallocate memory
   * so it can only be used when the new problem size is the same as
   * the problem size when CVodeCreate was called. */
  retval = CVodeReInit(cvode_mem, t0, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* ---- Integrate to the discontinuity */

  /* Set TSTOP (max time solution proceeds to) to location of discont. */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* If TSTOP was not set, we'd need to find y(t1): */
  /* CVodeGetDky(cvode_mem, t1, 0, y); */

  /* ---- Integrate from the discontinuity */

  /* Reinitialize solver */
  retval = CVodeReInit(cvode_mem, t1, y);

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS2; /* use -5y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst2);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst = nst1 + nst2;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /*
   * ---------------------------------------------------------------
   * Discontinuity in RHS: Case 2 - let CVODE deal with it
   * Note that here we MUST set TSTOP to ensure that the
   * change in the RHS happens at the appropriate time
   * ---------------------------------------------------------------
   */

  printf("\nDiscontinuity in RHS: Case 2 - let CVODE deal with it\n\n");

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver. CVodeReInit does not reallocate memory
   * so it can only be used when the new problem size is the same as
   * the problem size when CVodeCreate was called. */
  retval = CVodeReInit(cvode_mem, t0, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* ---- Integrate to the discontinuity */

  /* Set TSTOP (max time solution proceeds to) to location of discont. */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* ---- Integrate from the discontinuity */

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS2; /* use -5y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst2 = nst - nst1;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /* Free memory */
  N_VDestroy(y);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}